

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmd_handler.cc
# Opt level: O2

void __thiscall
helix::parity::pmd_handler::subscribe(pmd_handler *this,string *sym,size_t max_orders)

{
  ulong uVar1;
  string local_120;
  order_book ob;
  
  std::__cxx11::string::string((string *)&local_120,(string *)sym);
  order_book::order_book(&ob,&local_120,0,max_orders);
  std::__cxx11::string::~string((string *)&local_120);
  ob._state = trading;
  uVar1 = sym->_M_string_length;
  if (uVar1 != 8) {
    std::__cxx11::string::insert((ulong)sym,uVar1,'\b' - (char)uVar1);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->_symbols,sym);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,helix::order_book>,std::allocator<std::pair<std::__cxx11::string_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string&,helix::order_book>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,helix::order_book>,std::allocator<std::pair<std::__cxx11::string_const,helix::order_book>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->_order_book_id_map,sym,&ob);
  order_book::~order_book(&ob);
  return;
}

Assistant:

void pmd_handler::subscribe(std::string sym, size_t max_orders)
{
    helix::order_book ob{sym, 0, max_orders};
    ob.set_state(trading_state::trading);
    auto padding = PMD_INSTRUMENT_LEN - sym.size();
    if (padding > 0) {
        sym.insert(sym.size(), padding, ' ');
    }
    _symbols.insert(sym);
    _order_book_id_map.emplace(sym, std::move(ob));
}